

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

bool __thiscall
Rml::Element::AddAnimationKeyTime
          (Element *this,PropertyId property_id,Property *target_value,float time,Tween tween)

{
  bool bVar1;
  PropertyId PVar2;
  reference this_00;
  bool result;
  ElementAnimation *existing_animation;
  iterator __end1;
  iterator __begin1;
  ElementAnimationList *__range1;
  ElementAnimation *animation;
  Property *pPStack_38;
  float time_local;
  Property *target_value_local;
  PropertyId property_id_local;
  Element *this_local;
  Tween tween_local;
  
  pPStack_38 = target_value;
  if (target_value == (Property *)0x0) {
    pPStack_38 = ElementStyle::GetProperty(&this->meta->style,property_id);
  }
  if (pPStack_38 == (Property *)0x0) {
    tween_local.callback._7_1_ = false;
  }
  else {
    __range1 = (ElementAnimationList *)0x0;
    __end1 = ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::begin
                       (&this->animations);
    existing_animation =
         (ElementAnimation *)
         ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::end
                   (&this->animations);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<Rml::ElementAnimation_*,_std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>_>
                                       *)&existing_animation), this_00 = (reference)__range1, bVar1)
    {
      this_00 = __gnu_cxx::
                __normal_iterator<Rml::ElementAnimation_*,_std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>_>
                ::operator*(&__end1);
      PVar2 = ElementAnimation::GetPropertyId(this_00);
      if (PVar2 == property_id) break;
      __gnu_cxx::
      __normal_iterator<Rml::ElementAnimation_*,_std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>_>
      ::operator++(&__end1);
    }
    __range1 = (ElementAnimationList *)this_00;
    if (__range1 == (ElementAnimationList *)0x0) {
      tween_local.callback._7_1_ = false;
    }
    else {
      tween_local.callback._7_1_ =
           ElementAnimation::AddKey((ElementAnimation *)__range1,time,pPStack_38,this,tween,true);
    }
  }
  return tween_local.callback._7_1_;
}

Assistant:

bool Element::AddAnimationKeyTime(PropertyId property_id, const Property* target_value, float time, Tween tween)
{
	if (!target_value)
		target_value = meta->style.GetProperty(property_id);
	if (!target_value)
		return false;

	ElementAnimation* animation = nullptr;

	for (auto& existing_animation : animations)
	{
		if (existing_animation.GetPropertyId() == property_id)
		{
			animation = &existing_animation;
			break;
		}
	}
	if (!animation)
		return false;

	bool result = animation->AddKey(time, *target_value, *this, tween, true);

	return result;
}